

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map_checked.hh
# Opt level: O0

void __thiscall doublechecked::Roaring64Map::Roaring64Map(Roaring64Map *this,Roaring64Map *r)

{
  Roaring64Map *in_RSI;
  Roaring64Map *in_RDI;
  
  roaring::Roaring64Map::Roaring64Map(in_RSI);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             0x11e4f9);
  roaring::Roaring64Map::operator=(in_RSI,in_RDI);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::operator=
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)in_RSI,
             (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)in_RDI)
  ;
  return;
}

Assistant:

Roaring64Map(Roaring64Map &&r) noexcept {
        plain = std::move(r.plain);
        check = std::move(r.check);
    }